

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O0

int Abc_NtkCleanup(Abc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *vNodes_00;
  int Counter;
  Vec_Ptr_t *vNodes;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 != 0) {
    vNodes_00 = Abc_NtkDfs(pNtk,0);
    uVar2 = Abc_NtkReduceNodes(pNtk,vNodes_00);
    if (fVerbose != 0) {
      printf("Cleanup removed %d dangling nodes.\n",(ulong)uVar2);
    }
    Vec_PtrFree(vNodes_00);
    return uVar2;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                ,0x1e2,"int Abc_NtkCleanup(Abc_Ntk_t *, int)");
}

Assistant:

int Abc_NtkCleanup( Abc_Ntk_t * pNtk, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    int Counter;
    assert( Abc_NtkIsLogic(pNtk) );
    // mark the nodes reachable from the POs
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Counter = Abc_NtkReduceNodes( pNtk, vNodes );
    if ( fVerbose )
        printf( "Cleanup removed %d dangling nodes.\n", Counter );
    Vec_PtrFree( vNodes );
    return Counter;
}